

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_quotient(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand oVar2;
  operand local_d4;
  operand local_d0 [2];
  string local_c8;
  string error;
  string division_by_zero;
  string l2;
  string l1;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  division_by_zero._M_dataplus._M_p = (pointer)&division_by_zero.field_2;
  division_by_zero._M_string_length = 0;
  division_by_zero.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  label_to_string_abi_cxx11_(&l1,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&l2,psVar1,lab);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_c8,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)&error,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    psVar1 = label;
    label = label + 1;
    label_to_string_abi_cxx11_(&local_c8,psVar1,lab_01);
    std::__cxx11::string::operator=((string *)&division_by_zero,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    local_c8._M_dataplus._M_p._0_4_ = 5;
    local_d4 = R11;
    local_d0[0] = NUMBER;
    local_d0[1] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_c8,&local_d4,local_d0,(int *)(local_d0 + 1));
    local_c8._M_dataplus._M_p._0_4_ = 0x30;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_c8,&error);
  }
  jump_short_if_arg_is_not_block(code,RCX,R11,&l1);
  local_d4 = AH;
  local_d0[0] = RCX;
  local_d0[1] = 0x39;
  local_c8._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_d4,local_d0,local_d0 + 1,(unsigned_long *)&local_c8);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RCX,R11,&error);
  }
  local_c8._M_dataplus._M_p._0_4_ = 0x43;
  local_d0[0] = MEM_RCX;
  local_d0[1] = 8;
  local_d4 = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_c8,&local_d4,local_d0,(int *)(local_d0 + 1));
  local_c8._M_dataplus._M_p._0_4_ = 0xc;
  local_d4 = RCX;
  local_d0[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_c8,&local_d4,local_d0);
  local_c8._M_dataplus._M_p._0_4_ = 0x55;
  local_d4 = RCX;
  local_d0[0] = NUMBER;
  local_d0[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_c8,&local_d4,local_d0,(int *)(local_d0 + 1));
  local_c8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_c8,&l1);
  oVar2 = RDX;
  jump_short_if_arg_is_not_block(code,RDX,R11,&l2);
  local_d4 = AH;
  local_d0[0] = RDX;
  local_d0[1] = 0x39;
  local_c8._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_d4,local_d0,local_d0 + 1,(unsigned_long *)&local_c8);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RDX,R11,&error);
  }
  local_c8._M_dataplus._M_p._0_4_ = 0x43;
  local_d0[0] = MEM_RDX;
  local_d0[1] = 8;
  local_d4 = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_c8,&local_d4,local_d0,(int *)(local_d0 + 1));
  local_c8._M_dataplus._M_p._0_4_ = 0xc;
  local_d0[0] = XMM0;
  local_d4 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_c8,&local_d4,local_d0);
  local_c8._M_dataplus._M_p._0_4_ = 0x55;
  local_d4 = RDX;
  local_d0[0] = NUMBER;
  local_d0[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_c8,&local_d4,local_d0,(int *)(local_d0 + 1));
  local_c8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_c8,&l2);
  if (ops->safe_primitives == true) {
    local_c8._M_dataplus._M_p._0_4_ = 0x5a;
    local_d4 = RCX;
    local_d0[0] = NUMBER;
    local_d0[1] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_c8,&local_d4,local_d0,(int *)(local_d0 + 1));
    local_c8._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_c8,&error);
    local_c8._M_dataplus._M_p._0_4_ = 0x5a;
    local_d4 = RDX;
    local_d0[0] = NUMBER;
    local_d0[1] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_c8,&local_d4,local_d0,(int *)(local_d0 + 1));
    local_c8._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_c8,&error);
    local_c8._M_dataplus._M_p._0_4_ = 0x5a;
    local_d4 = oVar2;
    local_d0[0] = oVar2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&local_c8,&local_d4,local_d0);
    local_c8._M_dataplus._M_p._0_4_ = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_c8,&division_by_zero);
  }
  local_c8._M_dataplus._M_p._0_4_ = 0x40;
  local_d4 = RAX;
  local_d0[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_c8,&local_d4,local_d0);
  local_c8._M_dataplus._M_p._0_4_ = 0x40;
  local_d4 = RCX;
  local_d0[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_c8,&local_d4,local_d0);
  local_c8._M_dataplus._M_p._0_4_ = 0x5c;
  local_d4 = oVar2;
  local_d0[0] = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_c8,&local_d4,local_d0);
  local_c8._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation>(code,(operation *)&local_c8);
  local_c8._M_dataplus._M_p._0_4_ = 0x29;
  local_d4 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_c8,&local_d4);
  local_c8._M_dataplus._M_p._0_4_ = 0x55;
  local_d4 = RAX;
  local_d0[0] = NUMBER;
  local_d0[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_c8,&local_d4,local_d0,(int *)(local_d0 + 1));
  local_c8._M_dataplus._M_p._0_4_ = 0x2c;
  local_d4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_c8,&local_d4);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_quotient_contract_violation);
    error_label(code,&division_by_zero,re_division_by_zero);
  }
  std::__cxx11::string::~string((string *)&l2);
  std::__cxx11::string::~string((string *)&l1);
  std::__cxx11::string::~string((string *)&division_by_zero);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_quotient(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string division_by_zero;
  std::string l1 = label_to_string(label++);
  std::string l2 = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    division_by_zero = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JL, error);
    }
  jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, l1);
  //rcx is a block
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::CVTTSD2SI, asmcode::RCX, asmcode::XMM0);
  code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::LABEL, l1);

  jump_short_if_arg_is_not_block(code, asmcode::RDX, asmcode::R11, l2);
  //rdx is a block
  code.add(asmcode::AND, asmcode::RDX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RDX, asmcode::R11, error);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RDX, CELLS(1));
  code.add(asmcode::CVTTSD2SI, asmcode::RDX, asmcode::XMM0);
  code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
  code.add(asmcode::LABEL, l2);

  if (ops.safe_primitives)
    {
    code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::RDX);
    code.add(asmcode::JES, division_by_zero);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::XOR, asmcode::RDX, asmcode::RDX);
  code.add(asmcode::CQO);
  code.add(asmcode::IDIV, asmcode::RCX);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_quotient_contract_violation);
    error_label(code, division_by_zero, re_division_by_zero);
    }
  }